

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iStack.h
# Opt level: O2

iStack<Imaginer::Utils::iRpn::RPNnode> __thiscall
Imaginer::Utils::iStack<Imaginer::Utils::iRpn::RPNnode>::cut
          (iStack<Imaginer::Utils::iRpn::RPNnode> *this,int start,int end)

{
  int in_ECX;
  int iVar1;
  undefined8 extraout_RDX;
  undefined8 uVar2;
  undefined8 extraout_RDX_00;
  long lVar3;
  undefined4 in_register_00000034;
  long *plVar4;
  long lVar5;
  long lVar6;
  iStack<Imaginer::Utils::iRpn::RPNnode> iVar7;
  int local_34;
  
  plVar4 = (long *)CONCAT44(in_register_00000034,start);
  iStack(this,&local_34);
  iVar1 = *(int *)((long)plVar4 + 0xc) + 1;
  if (in_ECX <= *(int *)((long)plVar4 + 0xc)) {
    iVar1 = in_ECX;
  }
  lVar6 = (long)end;
  lVar5 = lVar6 << 0x20;
  lVar3 = lVar6 << 4;
  uVar2 = extraout_RDX;
  for (; lVar6 < iVar1; lVar6 = lVar6 + 1) {
    push(this,(RPNnode *)(*plVar4 + lVar3));
    lVar5 = lVar5 + 0x100000000;
    lVar3 = lVar3 + 0x10;
    uVar2 = extraout_RDX_00;
  }
  *plVar4 = *plVar4 + (lVar5 >> 0x1c);
  *(int *)((long)plVar4 + 0xc) = *(int *)((long)plVar4 + 0xc) - (int)lVar6;
  iVar7._size = (int)uVar2;
  iVar7._top = (int)((ulong)uVar2 >> 0x20);
  iVar7._data = (RPNnode *)this;
  return iVar7;
}

Assistant:

iStack<Type>  cut(int start = 0,int end = 1024)
    {
        iStack<Type> rt;
        (end > size())?(end = size()+1):(end);
        int i = start;
        while(i < end)
        {
            rt.push(_data[i++]);
        }
        _data = _data+i;
        _top-=i;
        return rt;
    }